

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ZlibContext * __thiscall
kj::_::NullableValue<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::
emplace<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode,kj::CompressionParameters&>
          (NullableValue<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *this,Mode *params,
          CompressionParameters *params_1)

{
  Mode *params_00;
  CompressionParameters *params_1_00;
  CompressionParameters *params_local_1;
  Mode *params_local;
  NullableValue<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>(&(this->field_1).value);
  }
  params_00 = fwd<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode>(params);
  params_1_00 = fwd<kj::CompressionParameters&>(params_1);
  ctor<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext,kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode,kj::CompressionParameters&>
            (&(this->field_1).value,params_00,params_1_00);
  this->isSet = true;
  return (ZlibContext *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }